

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffu8fi8(ULONGLONG *input,long ntodo,double scale,double zero,LONGLONG *output,int *status)

{
  ULONGLONG UVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dvalue;
  long ii;
  int *status_local;
  LONGLONG *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  ULONGLONG *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 9.223372036854776e+18)) || (NAN(zero))) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        UVar1 = input[ii];
        auVar3._8_4_ = (int)(UVar1 >> 0x20);
        auVar3._0_8_ = UVar1;
        auVar3._12_4_ = 0x45300000;
        dVar2 = (((auVar3._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)UVar1) - 4503599627370496.0)) - zero) / scale;
        if (-9.223372036854776e+18 <= dVar2) {
          if (dVar2 <= 9.223372036854776e+18) {
            if (dVar2 < 0.0) {
              output[ii] = (long)(dVar2 - 0.5);
            }
            else {
              output[ii] = (long)(dVar2 + 0.5);
            }
          }
          else {
            *status = -0xb;
            output[ii] = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          output[ii] = -0x8000000000000000;
        }
      }
    }
    else {
      for (ii = 0; ii < ntodo; ii = ii + 1) {
        if (input[ii] < 0x8000000000000000) {
          output[ii] = input[ii];
        }
        else {
          *status = -0xb;
          output[ii] = 0x7fffffffffffffff;
        }
      }
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      output[ii] = input[ii] ^ 0x8000000000000000;
    }
  }
  return *status;
}

Assistant:

int ffu8fi8(ULONGLONG *input,       /* I - array of values to be converted  */
            long ntodo,             /* I - number of elements in the array  */
            double scale,           /* I - FITS TSCALn or BSCALE value      */
            double zero,            /* I - FITS TZEROn or BZERO  value      */
            LONGLONG *output,       /* O - output array of converted values */
            int *status)            /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero ==  9223372036854775808.)
    {       
        /* Writing to unsigned long long column. */
        /* Instead of subtracting 9223372036854775808, it is more efficient */
        /* and more precise to just flip the sign bit with the XOR operator */

        /* no need to check range limits because all input values */
	/* are valid ULONGLONG values. */

        for (ii = 0; ii < ntodo; ii++) {
             output[ii] =  ((LONGLONG) input[ii]) ^ 0x8000000000000000;
        }
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++) {
            if (input[ii] > LONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
            {
	        output[ii] = input[ii];
	    }
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DLONGLONG_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MIN;
            }
            else if (dvalue > DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (LONGLONG) (dvalue + .5);
                else
                    output[ii] = (LONGLONG) (dvalue - .5);
            }
        }
    }
    return(*status);
}